

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture2d.cpp
# Opt level: O0

void __thiscall Texture2D::init_texture(Texture2D *this)

{
  socklen_t in_ECX;
  sockaddr *__addr;
  Texture2D *pTVar1;
  Texture2D *this_local;
  
  pTVar1 = this;
  (*glad_glGenTextures)(1,&this->m_id);
  bind(this,(int)pTVar1,__addr,in_ECX);
  return;
}

Assistant:

void Texture2D::init_texture()
{
#if OPENGL_VERSION >= 45
    glCreateTextures(GL_TEXTURE_2D, 1, &m_id);
#else
    glGenTextures(1, &m_id);
    bind();
#endif
}